

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O3

PipelineResourceSignatureInternalDataVk * __thiscall
Diligent::PipelineResourceSignatureVkImpl::GetInternalData
          (PipelineResourceSignatureInternalDataVk *__return_storage_ptr__,
          PipelineResourceSignatureVkImpl *this)

{
  ImmutableSamplerAttribsType *pIVar1;
  SHADER_TYPE SVar2;
  Uint16 UVar3;
  
  SVar2 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
          m_StaticResShaderStages;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).ShaderStages =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_ShaderStages;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).StaticResShaderStages = SVar2;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).PipelineType =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_PipelineType;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  )._Padding = '\0';
  *(undefined4 *)
   (__return_storage_ptr__->
   super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
   ).StaticResStageIndex._M_elems =
       *(undefined4 *)
        (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
        m_StaticResStageIndex._M_elems;
  *(undefined2 *)
   ((__return_storage_ptr__->
    super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
    ).StaticResStageIndex._M_elems + 4) =
       *(undefined2 *)
        ((this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
         m_StaticResStageIndex._M_elems + 4);
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).NumResources =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
       .m_Desc.NumResources;
  pIVar1 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
           m_pImmutableSamplerAttribs;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).pResourceAttribs =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_pResourceAttribs;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).pImmutableSamplers = pIVar1;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).NumImmutableSamplers =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
       .m_Desc.NumImmutableSamplers;
  UVar3 = this->m_DynamicStorageBufferCount;
  __return_storage_ptr__->DynamicUniformBufferCount = this->m_DynamicUniformBufferCount;
  __return_storage_ptr__->DynamicStorageBufferCount = UVar3;
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureInternalDataVk PipelineResourceSignatureVkImpl::GetInternalData() const
{
    PipelineResourceSignatureInternalDataVk InternalData = TPipelineResourceSignatureBase::GetInternalData();

    InternalData.DynamicStorageBufferCount = m_DynamicStorageBufferCount;
    InternalData.DynamicUniformBufferCount = m_DynamicUniformBufferCount;

    return InternalData;
}